

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Instr * __thiscall
flow::IRBuilder::createStore(IRBuilder *this,Value *lhs,ConstantInt *index,Value *rhs,string *name)

{
  long lVar1;
  Instr *pIVar2;
  Value *local_50;
  ConstantInt *local_48;
  Value *local_40;
  string local_38;
  
  local_50 = rhs;
  local_48 = index;
  local_40 = lhs;
  if (lhs != (Value *)0x0) {
    lVar1 = __dynamic_cast(lhs,&Value::typeinfo,&AllocaInstr::typeinfo,0);
    if (lVar1 != 0) {
      makeName(&local_38,this,name);
      pIVar2 = &insert<flow::StoreInstr,flow::Value*&,flow::ConstantValue<long,(flow::LiteralType)2>*&,flow::Value*&,std::__cxx11::string>
                          (this,&local_40,&local_48,&local_50,&local_38)->super_Instr;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      return pIVar2;
    }
  }
  __assert_fail("dynamic_cast<AllocaInstr*>(lhs) && \"lhs must be of type AllocaInstr in order to STORE to.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x7d,
                "Instr *flow::IRBuilder::createStore(Value *, ConstantInt *, Value *, const std::string &)"
               );
}

Assistant:

Instr* IRBuilder::createStore(Value* lhs, ConstantInt* index, Value* rhs,
                              const std::string& name) {
  assert(dynamic_cast<AllocaInstr*>(lhs) &&
         "lhs must be of type AllocaInstr in order to STORE to.");
  // assert(lhs->type() == rhs->type() && "Type of lhs and rhs must be equal.");
  // assert(dynamic_cast<IRVariable*>(lhs) && "lhs must be of type Variable.");

  return insert<StoreInstr>(lhs, index, rhs, makeName(name));
}